

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O2

uint __thiscall
polyscope::render::ManagedBuffer<unsigned_int>::getValue
          (ManagedBuffer<unsigned_int> *this,size_t ind)

{
  CanonicalDataSource CVar1;
  uint32_t uVar2;
  pointer puVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  element_type *buff;
  string sStack_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (this->deviceBufferType - Texture1d < 3) {
    ensureHostBufferPopulated(this);
  }
  CVar1 = currentCanonicalDataSource(this);
  if (CVar1 == RenderBuffer) {
    buff = (this->renderAttributeBuffer).
           super___shared_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    if (buff->dataSize <= (long)ind) {
      std::operator+(&local_98,"out of bounds access in ManagedBuffer ",&this->name);
      std::operator+(&local_d8,&local_98," getValue(");
      std::__cxx11::to_string(&sStack_f8,ind);
      std::operator+(&local_b8,&local_d8,&sStack_f8);
      std::operator+(&local_78,&local_b8,")");
      exception(&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&sStack_f8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_98);
      buff = (this->renderAttributeBuffer).
             super___shared_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    }
    uVar2 = getAttributeBufferData<unsigned_int>(buff,ind);
    return uVar2;
  }
  if (CVar1 == NeedsCompute) {
    std::function<void_()>::operator()(&this->computeFunc);
    puVar3 = (this->data->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (ind < (ulong)((long)(this->data->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_finish - (long)puVar3 >> 2))
    goto LAB_001eb49f;
    std::operator+(&local_98,"out of bounds access in ManagedBuffer ",&this->name);
    std::operator+(&local_d8,&local_98," getValue(");
    std::__cxx11::to_string(&sStack_f8,ind);
    std::operator+(&local_b8,&local_d8,&sStack_f8);
    std::operator+(&local_58,&local_b8,")");
    exception(&local_58);
    this_00 = &local_58;
  }
  else {
    if (CVar1 != HostData) {
      return 0;
    }
    puVar3 = (this->data->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (ind < (ulong)((long)(this->data->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_finish - (long)puVar3 >> 2))
    goto LAB_001eb49f;
    std::operator+(&local_98,"out of bounds access in ManagedBuffer ",&this->name);
    std::operator+(&local_d8,&local_98," getValue(");
    std::__cxx11::to_string(&sStack_f8,ind);
    std::operator+(&local_b8,&local_d8,&sStack_f8);
    std::operator+(&local_38,&local_b8,")");
    exception(&local_38);
    this_00 = &local_38;
  }
  std::__cxx11::string::~string((string *)this_00);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&sStack_f8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_98);
  puVar3 = (this->data->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
LAB_001eb49f:
  return puVar3[ind];
}

Assistant:

T ManagedBuffer<T>::getValue(size_t ind) {

  // For the texture case, always copy to the host and pull from there
  if (deviceBufferTypeIsTexture()) {
    ensureHostBufferPopulated();
  }

  switch (currentCanonicalDataSource()) {
  case CanonicalDataSource::HostData:
    if (ind >= data.size())
      exception("out of bounds access in ManagedBuffer " + name + " getValue(" + std::to_string(ind) + ")");
    return data[ind];
    break;

  case CanonicalDataSource::NeedsCompute:
    computeFunc();
    if (ind >= data.size())
      exception("out of bounds access in ManagedBuffer " + name + " getValue(" + std::to_string(ind) + ")");
    return data[ind];
    break;

  case CanonicalDataSource::RenderBuffer:

    // NOTE: right now this case should never happen unless deviceBufferType == DeviceBufferType::Attribute.
    // In the texture case, we cannot get a single pixel from the backend anyway, so we always
    // call ensureHostBufferPopulated() above and do the host access.

    if (static_cast<int64_t>(ind) >= renderAttributeBuffer->getDataSize())
      exception("out of bounds access in ManagedBuffer " + name + " getValue(" + std::to_string(ind) + ")");

    T val = getAttributeBufferData<T>(*renderAttributeBuffer, ind);
    return val;
    break;
  };

  return T(); // dummy return
}